

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::uhugeint_t,bool>
          (BaseAppender *this,Vector *col,uhugeint_t input)

{
  bool bVar1;
  InvalidInputException *this_00;
  uint64_t uVar2;
  uhugeint_t input_00;
  bool result;
  bool local_49;
  string local_48;
  
  uVar2 = 0;
  bVar1 = TryCast::Operation<duckdb::uhugeint_t,bool>(input,&local_49,false);
  if (bVar1) {
    col->data[(this->chunk).count] = local_49;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.upper = uVar2;
  input_00.lower = input.upper;
  CastExceptionText<duckdb::uhugeint_t,bool>(&local_48,(duckdb *)input.lower,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_48);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}